

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

bool __thiscall pbrt::Image::WritePFM(Image *this,string *filename,ImageMetadata *metadata)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  int c;
  long lVar6;
  Point2i p;
  Float FVar7;
  unique_ptr<float[],_std::default_delete<float[]>_> scanline;
  int vb;
  int va;
  ulong local_60;
  string *local_58;
  FILE *local_50;
  ulong local_48;
  WrapMode2D local_40;
  WrapMode2D local_38;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    Error<std::__cxx11::string_const&>("Unable to open output PFM file \"%s\"",filename);
    bVar5 = false;
  }
  else {
    local_58 = filename;
    std::make_unique<float[]>((size_t)&scanline);
    iVar1 = fprintf(__stream,"PF\n");
    if (-1 < iVar1) {
      iVar1 = fprintf(__stream,"%d %d\n",
                      (ulong)(uint)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x);
      if (-1 < iVar1) {
        iVar1 = fprintf(__stream,"%f\n",0xbff0000000000000);
        if (-1 < iVar1) {
          uVar4 = (ulong)(uint)(this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          local_50 = __stream;
          do {
            if ((int)uVar4 < 1) {
              bVar5 = true;
              goto LAB_00452cb1;
            }
            local_48 = uVar4 - 1;
            lVar6 = 0;
            uVar4 = 0;
            local_60 = local_48 << 0x20;
            while( true ) {
              __stream = local_50;
              lVar2 = (long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              if (lVar2 <= (long)uVar4) break;
              iVar1 = (int)(this->channelNames).nStored;
              if (iVar1 == 1) {
                WrapMode2D::WrapMode2D(&local_38,Clamp);
                FVar7 = GetChannel(this,(Point2i)(local_60 | uVar4),0,local_38);
                lVar2 = uVar4 * 0xc;
                *(Float *)((long)scanline._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + 8 + lVar2) =
                     FVar7;
                *(Float *)((long)scanline._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + 4 + lVar2) =
                     FVar7;
                *(Float *)((long)scanline._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar2) = FVar7
                ;
              }
              else {
                va = 3;
                if (iVar1 != 3) {
                  vb = iVar1;
                  LogFatal<char_const(&)[2],char_const(&)[12],char_const(&)[2],int&,char_const(&)[12],int&>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                             ,0x630,"Check failed: %s == %s with %s = %s, %s = %s",
                             (char (*) [2])0x52a601,(char (*) [12])0x6c0a92,(char (*) [2])0x52a601,
                             &va,(char (*) [12])0x6c0a92,&vb);
                }
                p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_60 | uVar4);
                vb = 3;
                for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
                  WrapMode2D::WrapMode2D(&local_40,Clamp);
                  FVar7 = GetChannel(this,p,(int)lVar2,local_40);
                  *(Float *)((long)scanline._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar6 +
                            lVar2 * 4) = FVar7;
                }
              }
              lVar6 = lVar6 + 0xc;
              uVar4 = uVar4 + 1;
            }
            sVar3 = fwrite((void *)scanline._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl,4,lVar2 * 3,
                           local_50);
            uVar4 = local_48;
          } while ((ulong)((long)(this->resolution).super_Tuple2<pbrt::Point2,_int>.x * 3) <= sVar3)
          ;
        }
      }
    }
    Error<std::__cxx11::string_const&>("Error writing PFM file \"%s\"",local_58);
    bVar5 = false;
LAB_00452cb1:
    fclose(__stream);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&scanline);
  }
  return bVar5;
}

Assistant:

bool Image::WritePFM(const std::string &filename, const ImageMetadata &metadata) const {
    FILE *fp = fopen(filename.c_str(), "wb");
    if (fp == nullptr) {
        Error("Unable to open output PFM file \"%s\"", filename);
        return false;
    }

    std::unique_ptr<float[]> scanline = std::make_unique<float[]>(3 * resolution.x);
    float scale;

    // only write 3 channel PFMs here...
    if (fprintf(fp, "PF\n") < 0)
        goto fail;

    // write the width and height, which must be positive
    if (fprintf(fp, "%d %d\n", resolution.x, resolution.y) < 0)
        goto fail;

    // write the scale, which encodes endianness
    scale = hostLittleEndian ? -1.f : 1.f;
    if (fprintf(fp, "%f\n", scale) < 0)
        goto fail;

    // write the data from bottom left to upper right as specified by
    // http://netpbm.sourceforge.net/doc/pfm.html
    // The raster is a sequence of pixels, packed one after another, with no
    // delimiters of any kind. They are grouped by row, with the pixels in each
    // row ordered left to right and the rows ordered bottom to top.
    for (int y = resolution.y - 1; y >= 0; y--) {
        for (int x = 0; x < resolution.x; ++x) {
            if (NChannels() == 1) {
                Float v = GetChannel({x, y}, 0);
                scanline[3 * x] = scanline[3 * x + 1] = scanline[3 * x + 2] = v;
            } else {
                CHECK_EQ(3, NChannels());
                for (int c = 0; c < 3; ++c)
                    // Assign element-wise in case Float is typedefed as
                    // 'double'.
                    scanline[3 * x + c] = GetChannel({x, y}, c);
            }
        }
        if (fwrite(&scanline[0], sizeof(float), 3 * resolution.x, fp) <
            (size_t)(3 * resolution.x))
            goto fail;
    }

    fclose(fp);
    return true;

fail:
    Error("Error writing PFM file \"%s\"", filename);
    fclose(fp);
    return false;
}